

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

size_t __thiscall ExportDirWrapper::mapNames(ExportDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type_conflict *pmVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar4;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  uVar6 = 0;
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar3,2,0x28,0)
  ;
  lVar4 = CONCAT44(extraout_var,iVar2);
  if (lVar4 != 0) {
    uVar6 = (ulong)*(uint *)(lVar4 + 0x18);
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      uVar8 = (ulong)*(uint *)(lVar4 + 0x24);
      sVar7 = 0;
      do {
        pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                 super_ExeElementWrapper.m_Exe;
        iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar1,uVar8,2,2,0);
        if ((key_type_conflict1 *)CONCAT44(extraout_var_00,iVar2) == (key_type_conflict1 *)0x0) {
          return sVar7;
        }
        pmVar5 = std::
                 map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
                 ::operator[](&this->ordToNameId,
                              (key_type_conflict1 *)CONCAT44(extraout_var_00,iVar2));
        *pmVar5 = (mapped_type_conflict)sVar7;
        uVar8 = uVar8 + 2;
        sVar7 = sVar7 + 1;
      } while (uVar6 != sVar7);
    }
  }
  return uVar6;
}

Assistant:

size_t ExportDirWrapper::mapNames()
{
    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxNames = exp->NumberOfNames;

    offset_t nameOrdRVA = exp->AddressOfNameOrdinals;
    //uint64_t nameRVA = exp->AddressOfNames;
    size_t i = 0;
    for (i = 0; i < maxNames; i++) {

        WORD* nameOrd = (WORD*) this->m_Exe->getContentAt(nameOrdRVA, Executable::RVA, sizeof(WORD));
        //DWORD* name = (DWORD*) this->m_Exe->getContentAt(nameRVA, Executable::RVA, sizeof(DWORD));
        if (nameOrd == NULL) break;

        this->ordToNameId[*nameOrd] = i;//*name;

        nameOrdRVA += sizeof(WORD);
        //nameRVA += sizeof(DWORD);
    }
    return i;
}